

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpFixed<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long uVar1;
  byte *pbVar2;
  FieldEntry *entry;
  char *pcVar3;
  string *psVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint *puVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 ctx_00;
  ushort uVar8;
  MessageLite *x;
  ushort uVar9;
  uint uVar10;
  long lStack_80;
  unsigned_short local_52;
  MessageLite *local_50;
  FieldEntry *local_48;
  ushort local_40 [8];
  
  ctx_00 = data.field_0;
  entry = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                    (table,(ulong)data.field_0 >> 0x20);
  uVar9 = entry->type_card & 0x30;
  if (uVar9 == 0x20) {
    pcVar3 = MpRepeatedFixed<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  uVar8 = entry->type_card & 0x1c0;
  uVar10 = data.field_0._0_4_ & 7;
  local_50 = msg;
  if (uVar8 == 0xc0) {
    if (uVar10 != 1) {
LAB_0014e43b:
      UNRECOVERED_JUMPTABLE = table->fallback;
      x = local_50;
      goto LAB_0014e4e3;
    }
  }
  else {
    local_52 = 0x80;
    local_48 = entry;
    local_40[0] = uVar8;
    psVar4 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                       (local_40,&local_52,"rep == static_cast<uint16_t>(field_layout::kRep32Bits)")
    ;
    if (psVar4 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x6c3,psVar4->_M_string_length,(psVar4->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_40);
    }
    entry = local_48;
    if (uVar10 != 5) goto LAB_0014e43b;
  }
  x = local_50;
  if (uVar9 == 0x30) {
    ChangeOneof(table,entry,data.field_0._0_4_ >> 3,(ParseContext *)ctx_00,local_50);
  }
  else if (uVar9 == 0x10) {
    pbVar2 = (byte *)((long)&local_50->_vptr_MessageLite + ((long)entry->has_idx >> 3));
    *pbVar2 = *pbVar2 | '\x01' << (entry->has_idx & 7U);
  }
  if (uVar8 == 0xc0) {
    uVar1 = *(unsigned_long *)ptr;
    puVar5 = RefAt<unsigned_long>(x,(ulong)entry->offset);
    *puVar5 = uVar1;
    lStack_80 = 8;
  }
  else {
    uVar10 = *(uint *)ptr;
    puVar7 = RefAt<unsigned_int>(x,(ulong)entry->offset);
    *puVar7 = uVar10;
    lStack_80 = 4;
  }
  ptr = ptr + lStack_80;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar7 = RefAt<unsigned_int>(x,(ulong)table->has_bits_offset);
      *puVar7 = *puVar7 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar10 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar10 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar6 = (ulong)(uVar10 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar6);
LAB_0014e4e3:
  pcVar3 = (*UNRECOVERED_JUMPTABLE)(x,ptr,ctx,data,table,hasbits);
  return pcVar3;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing (wiretype fallback is handled there):
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for mismatched wiretype:
  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint32_t decoded_wiretype = data.tag() & 7;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }
  // Set the field present:
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (card == field_layout::kFcOneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  // Copy the value:
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = UnalignedLoad<uint64_t>(ptr);
    ptr += sizeof(uint64_t);
  } else {
    RefAt<uint32_t>(base, entry.offset) = UnalignedLoad<uint32_t>(ptr);
    ptr += sizeof(uint32_t);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}